

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O3

var __thiscall cs_impl::list_cs_ext::back(list_cs_ext *this,list *lst)

{
  _List_node_base *p_Var1;
  long *plVar2;
  uint *local_38;
  long local_30;
  uint local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  if ((lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)lst) {
    p_Var1 = (lst->super__List_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl._M_node.
             super__List_node_base._M_prev[1]._M_next;
    if (p_Var1 != (_List_node_base *)0x0) {
      p_Var1->_M_prev = (_List_node_base *)((long)&p_Var1->_M_prev->_M_next + 1);
    }
    *(_List_node_base **)this = p_Var1;
    return (var)(proxy *)this;
  }
  plVar2 = (long *)__cxa_allocate_exception(0x20);
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"Call back() on empty list.","");
  *plVar2 = (long)(plVar2 + 2);
  if (local_38 == &local_28) {
    *(uint *)(plVar2 + 2) = local_28;
    *(undefined4 *)((long)plVar2 + 0x14) = uStack_24;
    *(undefined4 *)(plVar2 + 3) = uStack_20;
    *(undefined4 *)((long)plVar2 + 0x1c) = uStack_1c;
  }
  else {
    *plVar2 = (long)local_38;
    plVar2[2] = CONCAT44(uStack_24,local_28);
  }
  plVar2[1] = local_30;
  local_30 = 0;
  local_28 = local_28 & 0xffffff00;
  local_38 = &local_28;
  __cxa_throw(plVar2,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
}

Assistant:

bool is_dst(const std::tm &t)
		{
			return t.tm_isdst;
		}